

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_enc.c
# Opt level: O0

int VP8EncWrite(VP8Encoder *enc)

{
  WebPPicture *pic_00;
  int iVar1;
  int iVar2;
  VP8BitWriter *bw_00;
  size_t sVar3;
  VP8Encoder *enc_00;
  VP8Encoder *enc_01;
  VP8Encoder *in_RDI;
  size_t size;
  uint8_t *buf;
  size_t size0;
  uint8_t *part0;
  uint32_t padded_alpha_size;
  int p;
  size_t riff_size;
  size_t pad;
  size_t vp8_size;
  int ok;
  int final_percent;
  int percent_per_part;
  int task_percent;
  VP8BitWriter *bw;
  WebPPicture *pic;
  uint in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8c;
  byte in_stack_ffffffffffffff8d;
  undefined1 in_stack_ffffffffffffff8e;
  bool bVar4;
  byte bVar5;
  WebPPicture *in_stack_ffffffffffffff90;
  WebPPicture *in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffffb0;
  int iVar6;
  VP8Encoder *in_stack_ffffffffffffffb8;
  ulong local_38;
  uint local_30;
  uint local_4;
  
  pic_00 = in_RDI->pic_;
  bw_00 = &in_RDI->bw_;
  iVar1 = GeneratePartition0(in_stack_ffffffffffffffb8);
  if (iVar1 == 0) {
    local_4 = 0;
  }
  else {
    sVar3 = VP8BitWriterSize(bw_00);
    local_38 = sVar3 + 10 + (long)((in_RDI->num_parts_ + -1) * 3);
    for (iVar6 = 0; iVar6 < in_RDI->num_parts_; iVar6 = iVar6 + 1) {
      sVar3 = VP8BitWriterSize(in_RDI->parts_ + iVar6);
      local_38 = sVar3 + local_38;
    }
    enc_00 = (VP8Encoder *)((local_38 & 1) + local_38 + 0xc);
    iVar2 = IsVP8XNeeded(in_RDI);
    if (iVar2 != 0) {
      enc_00 = (VP8Encoder *)((long)&(enc_00->filter_hdr_).simple_ + 2);
    }
    if (in_RDI->has_alpha_ != 0) {
      in_stack_ffffffffffffffb0 = in_RDI->alpha_data_size_ + (in_RDI->alpha_data_size_ & 1);
      enc_00 = (VP8Encoder *)
               ((long)enc_00->parts_ + ((ulong)(in_stack_ffffffffffffffb0 + 8) - 0x70));
    }
    if (enc_00 < (VP8Encoder *)0xffffffff) {
      enc_01 = (VP8Encoder *)VP8BitWriterBuf(bw_00);
      sVar3 = VP8BitWriterSize(bw_00);
      bVar4 = false;
      if (iVar1 != 0) {
        iVar1 = PutWebPHeaders(enc_01,sVar3,(size_t)in_stack_ffffffffffffff98,
                               (size_t)in_stack_ffffffffffffff90);
        bVar4 = false;
        if (iVar1 != 0) {
          iVar1 = (*pic_00->writer)((uint8_t *)enc_01,sVar3,pic_00);
          bVar4 = false;
          if (iVar1 != 0) {
            iVar1 = EmitPartitionsSize(enc_00,(WebPPicture *)
                                              CONCAT44(iVar6,in_stack_ffffffffffffffb0));
            bVar4 = iVar1 != 0;
          }
        }
      }
      bVar5 = bVar4;
      VP8BitWriterWipeOut((VP8BitWriter *)0x180d9d);
      iVar1 = 0;
      while( true ) {
        iVar6 = (int)enc_00;
        local_30 = (uint)bVar4;
        if (in_RDI->num_parts_ <= iVar1) break;
        in_stack_ffffffffffffff98 = (WebPPicture *)VP8BitWriterBuf(in_RDI->parts_ + iVar1);
        in_stack_ffffffffffffff90 = (WebPPicture *)VP8BitWriterSize(in_RDI->parts_ + iVar1);
        if (in_stack_ffffffffffffff90 != (WebPPicture *)0x0) {
          in_stack_ffffffffffffff8e = false;
          if (local_30 != 0) {
            iVar6 = (*pic_00->writer)((uint8_t *)in_stack_ffffffffffffff98,
                                      (size_t)in_stack_ffffffffffffff90,pic_00);
            in_stack_ffffffffffffff8e = iVar6 != 0;
          }
          local_30 = (uint)(byte)in_stack_ffffffffffffff8e;
        }
        VP8BitWriterWipeOut((VP8BitWriter *)0x180e55);
        in_stack_ffffffffffffff8d = false;
        if (local_30 != 0) {
          iVar6 = WebPReportProgress(in_stack_ffffffffffffff98,
                                     (int)((ulong)in_stack_ffffffffffffff90 >> 0x20),
                                     (int *)CONCAT17(bVar5,CONCAT16(in_stack_ffffffffffffff8e,
                                                                    (uint6)CONCAT14(
                                                  in_stack_ffffffffffffff8c,
                                                  in_stack_ffffffffffffff88))));
          in_stack_ffffffffffffff8d = iVar6 != 0;
        }
        iVar1 = iVar1 + 1;
        bVar4 = (bool)in_stack_ffffffffffffff8d;
      }
      if ((local_30 != 0) && ((local_38 & 1) != 0)) {
        local_30 = PutPaddingByte(in_stack_ffffffffffffff90);
      }
      in_RDI->coded_size_ = iVar6 + 8;
      bVar4 = false;
      if (local_30 != 0) {
        iVar1 = WebPReportProgress(in_stack_ffffffffffffff98,
                                   (int)((ulong)in_stack_ffffffffffffff90 >> 0x20),
                                   (int *)CONCAT17(bVar5,CONCAT16(in_stack_ffffffffffffff8e,
                                                                  CONCAT15(in_stack_ffffffffffffff8d
                                                                           ,(uint5)
                                                  in_stack_ffffffffffffff88))));
        bVar4 = iVar1 != 0;
      }
      local_4 = (uint)bVar4;
      if (local_4 == 0) {
        WebPEncodingSetError(pic_00,VP8_ENC_ERROR_BAD_WRITE);
      }
    }
    else {
      local_4 = WebPEncodingSetError(pic_00,VP8_ENC_ERROR_FILE_TOO_BIG);
    }
  }
  return local_4;
}

Assistant:

int VP8EncWrite(VP8Encoder* const enc) {
  WebPPicture* const pic = enc->pic_;
  VP8BitWriter* const bw = &enc->bw_;
  const int task_percent = 19;
  const int percent_per_part = task_percent / enc->num_parts_;
  const int final_percent = enc->percent_ + task_percent;
  int ok = 0;
  size_t vp8_size, pad, riff_size;
  int p;

  // Partition #0 with header and partition sizes
  ok = GeneratePartition0(enc);
  if (!ok) return 0;

  // Compute VP8 size
  vp8_size = VP8_FRAME_HEADER_SIZE +
             VP8BitWriterSize(bw) +
             3 * (enc->num_parts_ - 1);
  for (p = 0; p < enc->num_parts_; ++p) {
    vp8_size += VP8BitWriterSize(enc->parts_ + p);
  }
  pad = vp8_size & 1;
  vp8_size += pad;

  // Compute RIFF size
  // At the minimum it is: "WEBPVP8 nnnn" + VP8 data size.
  riff_size = TAG_SIZE + CHUNK_HEADER_SIZE + vp8_size;
  if (IsVP8XNeeded(enc)) {  // Add size for: VP8X header + data.
    riff_size += CHUNK_HEADER_SIZE + VP8X_CHUNK_SIZE;
  }
  if (enc->has_alpha_) {  // Add size for: ALPH header + data.
    const uint32_t padded_alpha_size = enc->alpha_data_size_ +
                                       (enc->alpha_data_size_ & 1);
    riff_size += CHUNK_HEADER_SIZE + padded_alpha_size;
  }
  // RIFF size should fit in 32-bits.
  if (riff_size > 0xfffffffeU) {
    return WebPEncodingSetError(pic, VP8_ENC_ERROR_FILE_TOO_BIG);
  }

  // Emit headers and partition #0
  {
    const uint8_t* const part0 = VP8BitWriterBuf(bw);
    const size_t size0 = VP8BitWriterSize(bw);
    ok = ok && PutWebPHeaders(enc, size0, vp8_size, riff_size)
            && pic->writer(part0, size0, pic)
            && EmitPartitionsSize(enc, pic);
    VP8BitWriterWipeOut(bw);    // will free the internal buffer.
  }

  // Token partitions
  for (p = 0; p < enc->num_parts_; ++p) {
    const uint8_t* const buf = VP8BitWriterBuf(enc->parts_ + p);
    const size_t size = VP8BitWriterSize(enc->parts_ + p);
    if (size) ok = ok && pic->writer(buf, size, pic);
    VP8BitWriterWipeOut(enc->parts_ + p);    // will free the internal buffer.
    ok = ok && WebPReportProgress(pic, enc->percent_ + percent_per_part,
                                  &enc->percent_);
  }

  // Padding byte
  if (ok && pad) {
    ok = PutPaddingByte(pic);
  }

  enc->coded_size_ = (int)(CHUNK_HEADER_SIZE + riff_size);
  ok = ok && WebPReportProgress(pic, final_percent, &enc->percent_);
  if (!ok) WebPEncodingSetError(pic, VP8_ENC_ERROR_BAD_WRITE);
  return ok;
}